

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_matrix.h
# Opt level: O2

bool __thiscall xray_re::_matrix<float>::is_identity(_matrix<float> *this)

{
  float fVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  bool bVar4;
  undefined4 uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  
  auVar6._4_4_ = -(uint)((this->field_0).field_0._12 != 0.0);
  auVar6._0_4_ = -(uint)((this->field_0).field_0._11 != 1.0);
  auVar6._8_4_ = -(uint)((this->field_0).field_0._13 != 0.0);
  auVar6._12_4_ = -(uint)((this->field_0).field_0._14 != 0.0);
  auVar7._4_4_ = -(uint)((this->field_0).field_0._22 != 1.0);
  auVar7._0_4_ = -(uint)((this->field_0).field_0._21 != 0.0);
  auVar7._8_4_ = -(uint)((this->field_0).field_0._23 != 0.0);
  auVar7._12_4_ = -(uint)((this->field_0).field_0._24 != 0.0);
  auVar7 = packssdw(auVar6,auVar7);
  bVar3 = false;
  bVar4 = false;
  if ((((((((((((((((((((auVar7 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                       (auVar7 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar7 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar7 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar7 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar7 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar7 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar7 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar7 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar7 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar7 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar7 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar7 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar7 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar7 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar7[0xf]) &&
        (auVar2._4_4_ = -(uint)((this->field_0).field_0._32 != 0.0),
        auVar2._0_4_ = -(uint)((this->field_0).field_0._31 != 0.0),
        auVar2._8_4_ = -(uint)((this->field_0).field_0._33 != 1.0),
        auVar2._12_4_ = -(uint)((this->field_0).field_0._34 != 0.0), uVar5 = movmskps(0,auVar2),
        bVar4 = bVar3, (char)uVar5 == '\0')) && (fVar1 = (this->field_0).field_0._41, fVar1 == 0.0))
      && ((!NAN(fVar1) && (fVar1 = (this->field_0).field_0._42, fVar1 == 0.0)))) &&
     ((!NAN(fVar1) && ((fVar1 = (this->field_0).field_0._43, fVar1 == 0.0 && (!NAN(fVar1))))))) {
    bVar4 = (bool)(-((this->field_0).field_0._44 == 1.0) & 1);
  }
  return bVar4;
}

Assistant:

inline bool _matrix<T>::is_identity() const
{
	return _11 == 1 && _12 == 0 && _13 == 0 && _14 == 0 &&
			_21 == 0 && _22 == 1 && _23 == 0 && _24 == 0 &&
			_31 == 0 && _32 == 0 && _33 == 1 && _34 == 0 &&
			_41 == 0 && _42 == 0 && _43 == 0 && _44 == 1;
}